

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  char *pcVar1;
  ImGuiWindow *window;
  ImGuiWindowSettings *settings;
  
  pcVar1 = (ctx->SettingsWindows).Buf.Data;
  settings = (ImGuiWindowSettings *)(pcVar1 + 4);
  if (pcVar1 == (char *)0x0) {
    settings = (ImGuiWindowSettings *)0x0;
  }
  for (; settings != (ImGuiWindowSettings *)0x0;
      settings = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,settings)) {
    if (settings->WantApply == true) {
      window = ImGui::FindWindowByID(settings->ID);
      if (window != (ImGuiWindow *)0x0) {
        ApplyWindowSettings(window,settings);
      }
      settings->WantApply = false;
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->WantApply)
        {
            if (ImGuiWindow* window = ImGui::FindWindowByID(settings->ID))
                ApplyWindowSettings(window, settings);
            settings->WantApply = false;
        }
}